

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::transformed_draw_extra
          (Fl_PostScript_Graphics_Driver *this,char *str,int n,double x,double y,int w,bool rtl)

{
  Window WVar1;
  uint uVar2;
  uint face;
  int iVar3;
  Fl_Color bg;
  Fl_Color c;
  uint x_00;
  Window WVar4;
  Fl_Surface_Device *pFVar5;
  Fl_Display_Device *pFVar6;
  uchar *img_00;
  uchar *puVar7;
  void *data;
  float fVar8;
  double dVar9;
  int local_a8;
  uint local_a4;
  int i;
  int j;
  void *rle85;
  uchar *puStack_90;
  int wmask;
  uchar *di;
  uchar *mask;
  uchar *img;
  int w2;
  Fl_Surface_Device *_ss;
  Window _sw;
  Fl_Offscreen off;
  Fl_Color bg_color;
  Fl_Color text_color;
  int h;
  int w_scaled;
  Fl_Font fontnum;
  Fl_Fontsize old_size;
  float scale;
  bool rtl_local;
  int w_local;
  double y_local;
  double x_local;
  int n_local;
  char *str_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  uVar2 = Fl_Graphics_Driver::size(&this->super_Fl_Graphics_Driver);
  face = Fl_Graphics_Driver::font(&this->super_Fl_Graphics_Driver);
  iVar3 = (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x3a])();
  local_a4 = (uint)((float)iVar3 * 1.0);
  bg = Fl_Graphics_Driver::color(&this->super_Fl_Graphics_Driver);
  c = fl_contrast(0xff,bg);
  WVar4 = XCreatePixmap(fl_display,
                        *(undefined8 *)
                         (*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10),
                        (int)((float)w * 1.5),(int)((float)(int)local_a4 + 3.0),fl_visual->depth);
  WVar1 = fl_window;
  fl_window = WVar4;
  pFVar5 = Fl_Surface_Device::surface();
  pFVar6 = Fl_Display_Device::display_device();
  (*(pFVar6->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
  fl_push_no_clip();
  fl_color(c);
  fl_rectf(0,0,(int)((float)w * 1.5),(int)((float)(int)local_a4 + 3.0));
  fl_color(bg);
  Fl_Graphics_Driver::font_descriptor(fl_graphics_driver,(Fl_Font_Descriptor *)0x0);
  fl_font(face,0);
  fl_font(face,(int)((float)(int)uVar2 * 1.0));
  dVar9 = fl_width(str,n);
  x_00 = (uint)dVar9;
  if (rtl) {
    fl_rtl_draw(str,n,x_00,(int)((double)(int)local_a4 * 0.8));
  }
  else {
    fl_draw(str,n,1,(int)((double)(int)local_a4 * 0.8));
  }
  img_00 = fl_read_image((uchar *)0x0,1,1,x_00,local_a4,0);
  fl_pop_clip();
  fl_window = WVar1;
  (*(pFVar5->super_Fl_Device)._vptr_Fl_Device[3])();
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
            (this,(ulong)face,(ulong)uVar2);
  XFreePixmap(fl_display,WVar4);
  puVar7 = calc_mask(img_00,x_00,local_a4,c);
  if (img_00 != (uchar *)0x0) {
    operator_delete__(img_00);
  }
  fVar8 = (float)(int)x_00 / (float)w;
  clocale_printf(this,"%g %g %g %g %d %d MI\n",x,y - ((double)(int)local_a4 * 0.77) / (double)fVar8,
                 (double)((float)(int)x_00 / fVar8),(double)((float)(int)local_a4 / fVar8),
                 (ulong)x_00,(ulong)local_a4);
  iVar3 = (int)(x_00 + 7) / 8;
  data = prepare_rle85(this);
  while (local_a4 = local_a4 - 1, -1 < (int)local_a4) {
    puStack_90 = puVar7 + (int)(local_a4 * iVar3);
    for (local_a8 = 0; local_a8 < iVar3; local_a8 = local_a8 + 1) {
      write_rle85(this,*puStack_90,data);
      puStack_90 = puStack_90 + 1;
    }
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  if (puVar7 != (uchar *)0x0) {
    operator_delete__(puVar7);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::transformed_draw_extra(const char* str, int n, double x, double y, int w, bool rtl)
{
  // scale for bitmask computation
#if defined(USE_X11) && !USE_XFT
  float scale = 1; // don't scale because we can't expect to have scalable fonts
#else
  float scale = 2;
#endif
  Fl_Fontsize old_size = size();
  Fl_Font fontnum = Fl_Graphics_Driver::font();
  int w_scaled =  (int)(w * (scale + 0.5));
  int h = (int)(height() * scale);
  // create an offscreen image of the string
  Fl_Color text_color = Fl_Graphics_Driver::color();
  Fl_Color bg_color = fl_contrast(FL_WHITE, text_color);
  Fl_Offscreen off = fl_create_offscreen(w_scaled, (int)(h+3*scale) );
  fl_begin_offscreen(off);
  fl_color(bg_color);
  // color offscreen background with a shade contrasting with the text color
  fl_rectf(0, 0, w_scaled, (int)(h+3*scale) );
  fl_color(text_color);
#if defined(USE_X11) && !USE_XFT
  // force seeing this font as new so it's applied to the offscreen graphics context
  fl_graphics_driver->font_descriptor(NULL);
  fl_font(fontnum, 0);
#endif
  fl_font(fontnum, (Fl_Fontsize)(scale * old_size) );
  int w2 = (int)fl_width(str, n);
  // draw string in offscreen
  if (rtl) fl_rtl_draw(str, n, w2, (int)(h * 0.8) );
  else fl_draw(str, n, 1, (int)(h * 0.8) );
  // read (most of) the offscreen image
  uchar *img = fl_read_image(NULL, 1, 1, w2, h, 0);
  fl_end_offscreen();
  font(fontnum, old_size);
  fl_delete_offscreen(off);
  // compute the mask of what is not the background
  uchar *mask = calc_mask(img, w2, h, bg_color);
  delete[] img;
  // write the string image to PostScript as a scaled bitmask
  scale = w2 / float(w);
  clocale_printf("%g %g %g %g %d %d MI\n", x, y - h*0.77/scale, w2/scale, h/scale, w2, h);
  uchar *di;
  int wmask = (w2+7)/8;
  void *rle85 = prepare_rle85();
  for (int j = h - 1; j >= 0; j--){
    di = mask + j * wmask;
    for (int i = 0; i < wmask; i++){
      write_rle85(*di, rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  delete[] mask;
}